

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Appearance_PDU::SetAppearanceVisualFlag(Appearance_PDU *this,KBOOL F)

{
  KBOOL F_local;
  Appearance_PDU *this_local;
  
  if (F != (KBOOL)((this->m_AppearanceFlag1Union).m_ui8Flag >> 5 & 1)) {
    (this->m_AppearanceFlag1Union).m_ui8Flag =
         (this->m_AppearanceFlag1Union).m_ui8Flag & 0xdf | F << 5;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 4;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 4;
    }
  }
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceVisualFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Vis )return;

    m_AppearanceFlag1Union.m_ui8Vis = F;

    if( F )
    {
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}